

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

size_t __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateParseAuxTable
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  FieldDescriptor *descriptor;
  bool bVar2;
  int iVar3;
  Type TVar4;
  CType CVar5;
  LogMessage *pLVar6;
  Descriptor *pDVar7;
  Descriptor *pDVar8;
  mapped_type *pmVar9;
  long *plVar10;
  EnumDescriptor *this_00;
  undefined8 *puVar11;
  undefined1 qualified;
  pointer pbVar12;
  FieldDescriptor **ppFVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *pFVar16;
  size_t sVar17;
  undefined8 uVar18;
  _Alloc_hider _Var19;
  int iVar20;
  char *pcVar21;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  undefined1 local_1b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [3];
  undefined1 local_158 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  long local_128;
  undefined8 uStack_120;
  FieldDescriptor **local_118;
  FieldDescriptor *local_110;
  FieldDescriptor *local_108;
  long lStack_100;
  MessageGenerator *local_f8;
  string local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  key_type local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  Options *local_78;
  long local_70;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->table_driven_ == true) {
    anon_unknown_0::SortFieldsByNumber(&local_68,this->descriptor_);
    io::Printer::Print(printer,"::google::protobuf::internal::AuxillaryParseTableField(),\n");
    if (*(int *)(this->descriptor_ + 0x2c) < 1) {
      sVar17 = 1;
    }
    else {
      local_78 = &this->options_;
      local_80 = &this->classname_;
      iVar20 = 1;
      lVar15 = 0;
      local_f8 = this;
      do {
        descriptor = local_68.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar15];
        iVar3 = *(int *)(descriptor + 0x38);
        local_70 = lVar15;
        if (iVar3 < iVar20) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&local_198,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x7ae);
          pLVar6 = internal::LogMessage::operator<<
                             ((LogMessage *)&local_198,
                              "CHECK failed: (field->number()) >= (last_field_number): ");
          internal::LogFinisher::operator=((LogFinisher *)&local_d0,pLVar6);
          internal::LogMessage::~LogMessage((LogMessage *)&local_198);
          iVar3 = *(int *)(descriptor + 0x38);
        }
        if (iVar20 < iVar3) {
          do {
            io::Printer::Print(printer,"::google::protobuf::internal::AuxillaryParseTableField(),\n"
                              );
            iVar20 = iVar20 + 1;
          } while (iVar20 < *(int *)(descriptor + 0x38));
        }
        local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_d0._M_impl.super__Rb_tree_header._M_header;
        local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
        SetCommonFieldVariables
                  (descriptor,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_d0,local_78);
        TVar4 = FieldDescriptor::type(descriptor);
        qualified = 0x30;
        iVar3 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4);
        if (iVar3 == 8) {
          this_00 = FieldDescriptor::enum_type(descriptor);
          ClassName_abi_cxx11_
                    ((string *)&local_198,(cpp *)this_00,(EnumDescriptor *)0x1,(bool)qualified);
          local_1b8._0_8_ = local_1b8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"type","");
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&local_d0,(key_type *)local_1b8);
          std::__cxx11::string::operator=((string *)pmVar9,(string *)local_198._M_local_buf);
          if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
            operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_allocated_capacity != local_188) {
            operator_delete((void *)local_198._M_allocated_capacity,
                            local_188[0]._M_allocated_capacity + 1);
          }
          io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&local_d0,
                             "{::google::protobuf::internal::AuxillaryParseTableField::enum_aux{$type$_IsValid, \"$type$\" }},\n"
                            );
LAB_0025c2da:
          iVar20 = iVar20 + 1;
        }
        else {
          if (iVar3 == 9) {
            CVar5 = EffectiveStringCType(descriptor);
            if (CVar5 - FieldOptions_CType_CORD < 2) {
              CEscape((string *)local_158,*(string **)(descriptor + 0xa0));
              plVar10 = (long *)std::__cxx11::string::replace
                                          ((ulong)local_158,0,(char *)0x0,0x351830);
              local_1b8._0_8_ = local_1b8 + 0x10;
              pbVar12 = (pointer)(plVar10 + 2);
              if ((pointer)*plVar10 == pbVar12) {
                local_1b8._16_8_ = (pbVar12->_M_dataplus)._M_p;
                local_1b8._24_8_ = plVar10[3];
              }
              else {
                local_1b8._16_8_ = (pbVar12->_M_dataplus)._M_p;
                local_1b8._0_8_ = (pointer)*plVar10;
              }
              local_1b8._8_8_ = plVar10[1];
              *plVar10 = (long)pbVar12;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              plVar10 = (long *)std::__cxx11::string::append(local_1b8);
              local_198._M_allocated_capacity = (size_type)local_188;
              paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar10 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar10 == paVar14) {
                local_188[0]._0_8_ = paVar14->_M_allocated_capacity;
                local_188[0]._8_8_ = plVar10[3];
              }
              else {
                local_188[0]._0_8_ = paVar14->_M_allocated_capacity;
                local_198._M_allocated_capacity =
                     (size_type)
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar10;
              }
              local_198._8_8_ = plVar10[1];
              *plVar10 = (long)paVar14;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"default","");
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_d0,&local_a0);
              std::__cxx11::string::operator=((string *)pmVar9,(string *)local_198._M_local_buf);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_allocated_capacity != local_188) {
                operator_delete((void *)local_198._M_allocated_capacity,
                                local_188[0]._M_allocated_capacity + 1);
              }
              if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
                operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
              }
              uVar18 = local_158._16_8_;
              _Var19._M_p = (pointer)local_158._0_8_;
              if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
LAB_0025c170:
                operator_delete(_Var19._M_p,
                                (ulong)((long)&(((pointer)uVar18)->_M_dataplus)._M_p + 1));
              }
            }
            else {
              if (CVar5 != FieldOptions_CType_STRING) goto LAB_0025c178;
              lVar15 = *(long *)(*(long *)(descriptor + 0xa0) + 8);
              if (lVar15 == 0) {
                local_198._M_allocated_capacity = (size_type)local_188;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_198,
                           "&::google::protobuf::internal::fixed_address_empty_string","");
              }
              else {
                std::operator+(&local_50,"&",local_80);
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
                local_118 = &local_108;
                ppFVar13 = (FieldDescriptor **)(plVar10 + 2);
                if ((FieldDescriptor **)*plVar10 == ppFVar13) {
                  local_108 = *ppFVar13;
                  lStack_100 = plVar10[3];
                }
                else {
                  local_108 = *ppFVar13;
                  local_118 = (FieldDescriptor **)*plVar10;
                }
                local_110 = (FieldDescriptor *)plVar10[1];
                *plVar10 = (long)ppFVar13;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                FieldName_abi_cxx11_(&local_f0,(cpp *)descriptor,local_110);
                pFVar16 = (FieldDescriptor *)0xf;
                if (local_118 != &local_108) {
                  pFVar16 = local_108;
                }
                if (pFVar16 < local_110 + local_f0._M_string_length) {
                  uVar18 = (FieldDescriptor *)0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    uVar18 = local_f0.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar18 < local_110 + local_f0._M_string_length) goto LAB_0025bf96;
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_f0,0,(char *)0x0,(ulong)local_118);
                }
                else {
LAB_0025bf96:
                  puVar11 = (undefined8 *)
                            std::__cxx11::string::_M_append
                                      ((char *)&local_118,(ulong)local_f0._M_dataplus._M_p);
                }
                local_138._M_allocated_capacity = (size_type)&local_128;
                plVar10 = puVar11 + 2;
                if ((long *)*puVar11 == plVar10) {
                  local_128 = *plVar10;
                  uStack_120 = puVar11[3];
                }
                else {
                  local_128 = *plVar10;
                  local_138._M_allocated_capacity = (size_type)(long *)*puVar11;
                }
                local_138._8_8_ = puVar11[1];
                *puVar11 = plVar10;
                puVar11[1] = 0;
                *(undefined1 *)plVar10 = 0;
                plVar10 = (long *)std::__cxx11::string::append(local_138._M_local_buf);
                local_198._M_allocated_capacity = (size_type)local_188;
                paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 == paVar14) {
                  local_188[0]._0_8_ = paVar14->_M_allocated_capacity;
                  local_188[0]._8_8_ = plVar10[3];
                }
                else {
                  local_188[0]._0_8_ = paVar14->_M_allocated_capacity;
                  local_198._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar10;
                }
                local_198._8_8_ = plVar10[1];
                *plVar10 = (long)paVar14;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
              }
              local_1b8._0_8_ = local_1b8 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"default","");
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_d0,(key_type *)local_1b8);
              std::__cxx11::string::operator=((string *)pmVar9,(string *)local_198._M_local_buf);
              if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
                operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_198._M_allocated_capacity != local_188) {
                operator_delete((void *)local_198._M_allocated_capacity,
                                local_188[0]._M_allocated_capacity + 1);
              }
              if (lVar15 != 0) {
                if ((long *)local_138._M_allocated_capacity != &local_128) {
                  operator_delete((void *)local_138._M_allocated_capacity,local_128 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p,
                                  (ulong)(local_f0.field_2._M_allocated_capacity + 1));
                }
                if (local_118 != &local_108) {
                  operator_delete(local_118,(ulong)(local_108 + 1));
                }
                uVar18 = local_50.field_2._M_allocated_capacity;
                _Var19._M_p = local_50._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0025c170;
              }
            }
LAB_0025c178:
            local_198._M_allocated_capacity = (size_type)local_188;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"full_name","");
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_d0,(key_type *)&local_198);
            std::__cxx11::string::_M_assign((string *)pmVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_allocated_capacity != local_188) {
              operator_delete((void *)local_198._M_allocated_capacity,
                              local_188[0]._M_allocated_capacity + 1);
            }
            pcVar21 = "false";
            if (*(int *)(*(long *)(descriptor + 0x30) + 0x8c) == 3) {
              pcVar21 = "true";
            }
            local_198._M_allocated_capacity = (size_type)local_188;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"strict","");
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_d0,(key_type *)&local_198);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,(ulong)pcVar21);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_allocated_capacity != local_188) {
              operator_delete((void *)local_198._M_allocated_capacity,
                              local_188[0]._M_allocated_capacity + 1);
            }
            local_198._M_allocated_capacity = (size_type)local_188;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"type","");
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_d0,(key_type *)&local_198);
            std::__cxx11::string::_M_assign((string *)pmVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_allocated_capacity != local_188) {
              operator_delete((void *)local_198._M_allocated_capacity,
                              local_188[0]._M_allocated_capacity + 1);
            }
            io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&local_d0,
                               "{::google::protobuf::internal::AuxillaryParseTableField::string_aux{\n  $default$,\n  \"$full_name$\",\n  $strict$,\n  \"$type$\"\n}},\n"
                              );
            goto LAB_0025c2da;
          }
          if (iVar3 == 10) {
            local_158._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_158._8_8_ = (pointer)0x0;
            local_158._16_8_ = 0;
            pDVar7 = FieldDescriptor::message_type(descriptor);
            do {
              pDVar8 = pDVar7;
              pDVar7 = *(Descriptor **)(pDVar8 + 0x18);
            } while (*(Descriptor **)(pDVar8 + 0x18) != (Descriptor *)0x0);
            local_1b8._0_8_ = (pointer)0x0;
            local_1b8._8_8_ = (pointer)0x0;
            local_1b8._16_8_ = (pointer)0x0;
            SplitStringUsing(*(string **)(pDVar8 + 8),".",
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1b8);
            local_188[0]._0_8_ = local_158._16_8_;
            local_198._8_8_ = local_158._8_8_;
            local_198._M_allocated_capacity = local_158._0_8_;
            pbVar12 = (pointer)local_1b8._16_8_;
            local_158._16_8_ = local_1b8._16_8_;
            local_158._0_8_ = local_1b8._0_8_;
            local_158._8_8_ = local_1b8._8_8_;
            local_1b8._0_8_ = (pointer)0x0;
            local_1b8._8_8_ = (pointer)0x0;
            local_1b8._16_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_198);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b8);
            if (local_158._8_8_ == local_158._0_8_) {
              pbVar12 = (pointer)0x7cb;
              internal::LogMessage::LogMessage
                        ((LogMessage *)&local_198,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                         ,0x7cb);
              pLVar6 = internal::LogMessage::operator<<
                                 ((LogMessage *)&local_198,
                                  "CHECK failed: (package_parts.size()) != (0): ");
              internal::LogFinisher::operator=((LogFinisher *)local_1b8,pLVar6);
              internal::LogMessage::~LogMessage((LogMessage *)&local_198);
            }
            ((pointer)(local_158._8_8_ + -0x20))->_M_string_length = 0;
            *(((pointer)(local_158._8_8_ + -0x20))->_M_dataplus)._M_p = '\0';
            pDVar7 = FieldDescriptor::message_type(descriptor);
            ClassName_abi_cxx11_
                      ((string *)&local_198,(cpp *)pDVar7,(Descriptor *)0x0,SUB81(pbVar12,0));
            local_1b8._0_8_ = local_1b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"classname","");
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_d0,(key_type *)local_1b8);
            std::__cxx11::string::operator=((string *)pmVar9,(string *)local_198._M_local_buf);
            if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_allocated_capacity != local_188) {
              operator_delete((void *)local_198._M_allocated_capacity,
                              local_188[0]._M_allocated_capacity + 1);
            }
            Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)&local_198,(protobuf *)local_158,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x37bf8f,(char *)pbVar12);
            local_1b8._0_8_ = local_1b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"ns","");
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_d0,(key_type *)local_1b8);
            std::__cxx11::string::operator=((string *)pmVar9,(string *)local_198._M_local_buf);
            pFVar16 = extraout_RDX;
            if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
              pFVar16 = extraout_RDX_00;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_allocated_capacity != local_188) {
              operator_delete((void *)local_198._M_allocated_capacity,
                              local_188[0]._M_allocated_capacity + 1);
              pFVar16 = extraout_RDX_01;
            }
            FieldMessageTypeName_abi_cxx11_((string *)&local_198,(cpp *)descriptor,pFVar16);
            local_1b8._0_8_ = local_1b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"type","");
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_d0,(key_type *)local_1b8);
            std::__cxx11::string::operator=((string *)pmVar9,(string *)local_198._M_local_buf);
            if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_allocated_capacity != local_188) {
              operator_delete((void *)local_198._M_allocated_capacity,
                              local_188[0]._M_allocated_capacity + 1);
            }
            FileLevelNamespace((string *)&local_198,(string *)**(undefined8 **)(pDVar8 + 0x10));
            local_1b8._0_8_ = local_1b8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"file_namespace","")
            ;
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_d0,(key_type *)local_1b8);
            std::__cxx11::string::operator=((string *)pmVar9,(string *)local_198._M_local_buf);
            if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
              operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_allocated_capacity != local_188) {
              operator_delete((void *)local_198._M_allocated_capacity,
                              local_188[0]._M_allocated_capacity + 1);
            }
            io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&local_d0,
                               "{::google::protobuf::internal::AuxillaryParseTableField::message_aux{\n  &::$ns$_$classname$_default_instance_,\n"
                              );
            pDVar7 = FieldDescriptor::message_type(descriptor);
            uVar1._0_1_ = (local_f8->options_).enforce_lite;
            uVar1._1_1_ = (local_f8->options_).table_driven_parsing;
            uVar1._2_2_ = *(undefined2 *)&(local_f8->options_).field_0x26;
            bVar2 = anon_unknown_0::TableDrivenEnabled
                              ((anon_unknown_0 *)pDVar7,(Descriptor *)(ulong)uVar1,
                               (Options *)(ulong)(local_f8->options_).table_driven_parsing);
            if (bVar2) {
              io::Printer::Print(printer,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&local_d0,
                                 "  ::$ns$$file_namespace$::TableStruct::schema +\n    ::$ns$$classname$::kIndexInFileMessages,\n"
                                );
            }
            else {
              io::Printer::Print(printer,"  NULL,\n");
            }
            io::Printer::Print(printer,"}},\n");
            iVar20 = iVar20 + 1;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_158);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_d0);
        lVar15 = local_70 + 1;
      } while (lVar15 < *(int *)(local_f8->descriptor_ + 0x2c));
      sVar17 = (size_t)iVar20;
    }
    if (local_68.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    sVar17 = 0;
  }
  return sVar17;
}

Assistant:

size_t MessageGenerator::GenerateParseAuxTable(io::Printer* printer) {
  if (!table_driven_) {
    return 0;
  }

  std::vector<const FieldDescriptor*> ordered_fields =
      SortFieldsByNumber(descriptor_);

  printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
  int last_field_number = 1;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = ordered_fields[i];

    GOOGLE_CHECK_GE(field->number(), last_field_number);
    for (; last_field_number < field->number(); last_field_number++) {
      printer->Print("::google::protobuf::internal::AuxillaryParseTableField(),\n");
    }

    std::map<string, string> vars;
    SetCommonFieldVariables(field, &vars, options_);

    switch (field->cpp_type()) {
      case FieldDescriptor::CPPTYPE_ENUM:
        vars["type"] = ClassName(field->enum_type(), true);
        printer->Print(
            vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::enum_aux{"
            "$type$_IsValid, \"$type$\" }},\n");
        last_field_number++;
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        std::vector<string> package_parts;

        const Descriptor* outer = field->message_type();
        while (outer->containing_type() != NULL) {
          outer = outer->containing_type();
        }

        package_parts = Split(
            outer->full_name(), ".", true);
        // outer->full_name() contains the class itself.  Remove it as it is
        // used in the name of the default instance variable.
        GOOGLE_DCHECK_NE(package_parts.size(), 0);
        package_parts.back().clear();

        vars["classname"] = ClassName(field->message_type(), false);
        vars["ns"] = Join(package_parts, "::");
        vars["type"] = FieldMessageTypeName(field);
        vars["file_namespace"] = FileLevelNamespace(outer->file()->name());

        printer->Print(vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::message_aux{\n"
            "  &::$ns$_$classname$_default_instance_,\n");

        bool dont_emit_table =
            !TableDrivenEnabled(field->message_type(), options_);

        if (dont_emit_table) {
          printer->Print("  NULL,\n");
        } else {
          printer->Print(vars,
              "  ::$ns$$file_namespace$::TableStruct::schema +\n"
              "    ::$ns$$classname$::kIndexInFileMessages,\n");
        }

        printer->Print("}},\n");
        last_field_number++;
        break;
      }
      case FieldDescriptor::CPPTYPE_STRING:
        switch (EffectiveStringCType(field)) {
          case FieldOptions::STRING:
            vars["default"] =
                field->default_value_string().empty()
                  ? "&::google::protobuf::internal::fixed_address_empty_string"
                  : "&" + classname_ + "::_default_" + FieldName(field) + "_";
            break;
          case FieldOptions::CORD:
          case FieldOptions::STRING_PIECE:
            vars["default"] =
                "\"" + CEscape(field->default_value_string()) + "\"";
            break;
        }
        vars["full_name"] = field->full_name();
        vars["strict"] =
          field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3
          ? "true" : "false";
        vars["type"] = field->full_name();
        printer->Print(vars,
            "{::google::protobuf::internal::AuxillaryParseTableField::string_aux{\n"
            "  $default$,\n"
            "  \"$full_name$\",\n"
            "  $strict$,\n"
            "  \"$type$\"\n"
            "}},\n");
        last_field_number++;
        break;
      default:
        break;
    }
  }

  return last_field_number;
}